

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O3

scalar_function_t *
duckdb::GetIntegralCompressFunctionInputSwitch
          (scalar_function_t *__return_storage_ptr__,LogicalType *input_type,
          LogicalType *result_type)

{
  undefined *puVar1;
  uint uVar2;
  ulong uVar3;
  InternalException *pIVar4;
  undefined **ppuVar5;
  char cVar6;
  string local_40;
  
  uVar2 = (uint)input_type & 0xff;
  cVar6 = (char)result_type;
  if (uVar2 < 0x1e) {
    if (uVar2 < 0xe) {
      if (uVar2 == 0xc) {
        if (3 < (byte)(cVar6 - 0x1cU)) {
          pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,
                     "Unexpected result type in GetIntegralCompressFunctionResultSwitch","");
          InternalException::InternalException(pIVar4,&local_40);
          __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar3 = (ulong)(byte)(cVar6 - 0x1cU);
        ppuVar5 = &PTR_IntegralCompressFunction<short,unsigned_char>_02451d18;
      }
      else {
        if (uVar2 != 0xd) {
LAB_013c6106:
          pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,
                     "Unexpected input type in GetIntegralCompressFunctionInputSwitch","");
          InternalException::InternalException(pIVar4,&local_40);
          __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (3 < (byte)(cVar6 - 0x1cU)) {
          pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,
                     "Unexpected result type in GetIntegralCompressFunctionResultSwitch","");
          InternalException::InternalException(pIVar4,&local_40);
          __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar3 = (ulong)(byte)(cVar6 - 0x1cU);
        ppuVar5 = &PTR_IntegralCompressFunction<int,unsigned_char>_02451d38;
      }
    }
    else if (uVar2 == 0xe) {
      if (3 < (byte)(cVar6 - 0x1cU)) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "Unexpected result type in GetIntegralCompressFunctionResultSwitch","");
        InternalException::InternalException(pIVar4,&local_40);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar3 = (ulong)(byte)(cVar6 - 0x1cU);
      ppuVar5 = &PTR_IntegralCompressFunction<long,unsigned_char>_02451d58;
    }
    else {
      if (uVar2 != 0x1d) goto LAB_013c6106;
      if (3 < (byte)(cVar6 - 0x1cU)) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "Unexpected result type in GetIntegralCompressFunctionResultSwitch","");
        InternalException::InternalException(pIVar4,&local_40);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar3 = (ulong)(byte)(cVar6 - 0x1cU);
      ppuVar5 = &PTR_IntegralCompressFunction<unsigned_short,unsigned_char>_02451d98;
    }
  }
  else if (uVar2 < 0x31) {
    if (uVar2 == 0x1e) {
      if (3 < (byte)(cVar6 - 0x1cU)) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "Unexpected result type in GetIntegralCompressFunctionResultSwitch","");
        InternalException::InternalException(pIVar4,&local_40);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar3 = (ulong)(byte)(cVar6 - 0x1cU);
      ppuVar5 = &PTR_IntegralCompressFunction<unsigned_int,unsigned_char>_02451db8;
    }
    else {
      if (uVar2 != 0x1f) goto LAB_013c6106;
      if (3 < (byte)(cVar6 - 0x1cU)) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "Unexpected result type in GetIntegralCompressFunctionResultSwitch","");
        InternalException::InternalException(pIVar4,&local_40);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar3 = (ulong)(byte)(cVar6 - 0x1cU);
      ppuVar5 = &PTR_IntegralCompressFunction<unsigned_long,unsigned_char>_02451dd8;
    }
  }
  else if (uVar2 == 0x31) {
    if (3 < (byte)(cVar6 - 0x1cU)) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "Unexpected result type in GetIntegralCompressFunctionResultSwitch","");
      InternalException::InternalException(pIVar4,&local_40);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar3 = (ulong)(byte)(cVar6 - 0x1cU);
    ppuVar5 = &PTR_IntegralCompressFunction<duckdb::uhugeint_t,unsigned_char>_02451df8;
  }
  else {
    if (uVar2 != 0x32) goto LAB_013c6106;
    if (3 < (byte)(cVar6 - 0x1cU)) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "Unexpected result type in GetIntegralCompressFunctionResultSwitch","");
      InternalException::InternalException(pIVar4,&local_40);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar3 = (ulong)(byte)(cVar6 - 0x1cU);
    ppuVar5 = &PTR_IntegralCompressFunction<duckdb::hugeint_t,unsigned_char>_02451d78;
  }
  puVar1 = ppuVar5[uVar3];
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(undefined **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar1;
  __return_storage_ptr__->_M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  return (scalar_function_t *)
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_manager;
}

Assistant:

static scalar_function_t GetIntegralCompressFunctionInputSwitch(const LogicalType &input_type,
                                                                const LogicalType &result_type) {
	switch (input_type.id()) {
	case LogicalTypeId::SMALLINT:
		return GetIntegralCompressFunctionResultSwitch<int16_t>(input_type, result_type);
	case LogicalTypeId::INTEGER:
		return GetIntegralCompressFunctionResultSwitch<int32_t>(input_type, result_type);
	case LogicalTypeId::BIGINT:
		return GetIntegralCompressFunctionResultSwitch<int64_t>(input_type, result_type);
	case LogicalTypeId::HUGEINT:
		return GetIntegralCompressFunctionResultSwitch<hugeint_t>(input_type, result_type);
	case LogicalTypeId::USMALLINT:
		return GetIntegralCompressFunctionResultSwitch<uint16_t>(input_type, result_type);
	case LogicalTypeId::UINTEGER:
		return GetIntegralCompressFunctionResultSwitch<uint32_t>(input_type, result_type);
	case LogicalTypeId::UBIGINT:
		return GetIntegralCompressFunctionResultSwitch<uint64_t>(input_type, result_type);
	case LogicalTypeId::UHUGEINT:
		return GetIntegralCompressFunctionResultSwitch<uhugeint_t>(input_type, result_type);
	default:
		throw InternalException("Unexpected input type in GetIntegralCompressFunctionInputSwitch");
	}
}